

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

void __thiscall JumpBasic::analyzeGuards(JumpBasic *this,BlockBasic *bl,int4 pathout)

{
  int iVar1;
  pointer pGVar2;
  pointer pBVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  Varnode *v;
  int iVar6;
  int iVar7;
  bool bVar8;
  Varnode *markup;
  CircleRange rng;
  GuardRecord local_78;
  PcodeOp *op;
  
  pGVar2 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1 = ((this->super_JumpModel).jumptable)->recoverystage;
  if ((this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar2;
  }
  iVar7 = 0;
  while( true ) {
    if (iVar7 == 2) {
      return;
    }
    if ((pathout < 0) ||
       (lVar5 = (long)(bl->super_FlowBlock).outofthis.
                      super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(bl->super_FlowBlock).outofthis.
                      super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                      super__Vector_impl_data._M_start, (int)(lVar5 / 0x18) != 2)) {
      do {
        pBVar3 = (bl->super_FlowBlock).intothis.
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)(((long)(bl->super_FlowBlock).intothis.
                         super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pBVar3) / 0x18) != 1) {
          return;
        }
        bl = (BlockBasic *)pBVar3->point;
        lVar5 = (long)(bl->super_FlowBlock).outofthis.
                      super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(bl->super_FlowBlock).outofthis.
                      super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                      super__Vector_impl_data._M_start;
      } while ((int)(lVar5 / 0x18) == 1);
      pathout = pBVar3->reverse_index;
    }
    iVar4 = (*(bl->super_FlowBlock)._vptr_FlowBlock[0xe])(bl,0x18,lVar5 % 0x18);
    op = (PcodeOp *)CONCAT44(extraout_var,iVar4);
    if (op == (PcodeOp *)0x0) break;
    if (op->opcode->opcode != CPUI_CBRANCH) {
      return;
    }
    v = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_start[1];
    CircleRange::CircleRange(&rng,(bool)((byte)(op->flags >> 8) & 1 ^ pathout + -1 == 0));
    iVar4 = -(pathout + -1);
    if (((bl->super_FlowBlock).flags >> 0x10 & 1) == 0) {
      iVar4 = pathout;
    }
    GuardRecord::GuardRecord(&local_78,op,iVar4,&rng,v);
    std::vector<GuardRecord,_std::allocator<GuardRecord>_>::emplace_back<GuardRecord>
              (&this->selectguards,&local_78);
    iVar6 = 2;
    while ((((bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8 && ((v->flags & 0x10) != 0)) &&
            (v = CircleRange::pullBack(&rng,v->def,&markup,iVar1 == 0), v != (Varnode *)0x0)) &&
           (rng.isempty != true))) {
      GuardRecord::GuardRecord(&local_78,op,iVar4,&rng,v);
      std::vector<GuardRecord,_std::allocator<GuardRecord>_>::emplace_back<GuardRecord>
                (&this->selectguards,&local_78);
    }
    iVar7 = iVar7 + 1;
    pathout = -1;
  }
  return;
}

Assistant:

void JumpBasic::analyzeGuards(BlockBasic *bl,int4 pathout)

{ // Analyze each CBRANCH leading up to -bl- switch.
  // (if pathout>=0, also analyze the CBRANCH in -bl- that chooses this path)
  // Analyze the range restrictions on the various variables which allow
  // control flow to pass through the CBRANCHs to the switch.
  // Make note of all these restrictions in the guard list
  // For later determination of the correct switch variable.
  int4 i,j,indpath;
  int4 maxbranch = 2;		// Maximum number of CBRANCHs to consider
  int4 maxpullback = 2;
  bool usenzmask = (jumptable->getStage() == 0);

  selectguards.clear();
  BlockBasic *prevbl;
  Varnode *vn;

  for(i=0;i<maxbranch;++i) {
    if ((pathout>=0)&&(bl->sizeOut()==2)) {
      prevbl = bl;
      bl = (BlockBasic *)prevbl->getOut(pathout);
      indpath = pathout;
      pathout = -1;
    }
    else {
      pathout = -1;		// Make sure not to use pathout next time around
      for(;;) {
	if (bl->sizeIn() != 1) return; // Assume only 1 path to switch
	prevbl = (BlockBasic *)bl->getIn(0);
	if (prevbl->sizeOut() != 1) break; // Is it possible to deviate from switch path in this block
	bl = prevbl;		// If not, back up to next block
      }
      indpath = bl->getInRevIndex(0);
    }
    PcodeOp *cbranch = prevbl->lastOp();
    if ((cbranch==(PcodeOp *)0)||(cbranch->code() != CPUI_CBRANCH))
      break;
    bool toswitchval = (indpath == 1);
    if (cbranch->isBooleanFlip())
      toswitchval = !toswitchval;
    bl = prevbl;
    vn = cbranch->getIn(1);
    CircleRange rng(toswitchval);
    
    // The boolean variable could conceivably be the switch variable
    int4 indpathstore = prevbl->getFlipPath() ? 1-indpath : indpath;
    selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    for(j=0;j<maxpullback;++j) {
      Varnode *markup;		// Throw away markup information
      if (!vn->isWritten()) break;
      vn = rng.pullBack(vn->getDef(),&markup,usenzmask);
      if (vn == (Varnode *)0) break;
      if (rng.isEmpty()) break;
      selectguards.push_back(GuardRecord(cbranch,indpathstore,rng,vn));
    }
  }
}